

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O3

SUNErrCode SUNNonlinSolFree_FixedPoint(SUNNonlinearSolver NLS)

{
  void *__ptr;
  
  if (NLS != (SUNNonlinearSolver)0x0) {
    __ptr = NLS->content;
    if (__ptr != (void *)0x0) {
      if (*(long *)((long)__ptr + 0x68) != 0) {
        N_VDestroy(*(long *)((long)__ptr + 0x68));
        __ptr = NLS->content;
        *(undefined8 *)((long)__ptr + 0x68) = 0;
      }
      if (*(long *)((long)__ptr + 0x70) != 0) {
        N_VDestroy(*(long *)((long)__ptr + 0x70));
        __ptr = NLS->content;
        *(undefined8 *)((long)__ptr + 0x70) = 0;
      }
      if (*(long *)((long)__ptr + 0x78) != 0) {
        N_VDestroy(*(long *)((long)__ptr + 0x78));
        __ptr = NLS->content;
        *(undefined8 *)((long)__ptr + 0x78) = 0;
      }
      if (*(long *)((long)__ptr + 0x80) != 0) {
        N_VDestroy(*(long *)((long)__ptr + 0x80));
        __ptr = NLS->content;
        *(undefined8 *)((long)__ptr + 0x80) = 0;
      }
      if (*(long *)((long)__ptr + 0x88) != 0) {
        N_VDestroy(*(long *)((long)__ptr + 0x88));
        __ptr = NLS->content;
        *(undefined8 *)((long)__ptr + 0x88) = 0;
      }
      if (*(void **)((long)__ptr + 0x18) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x18));
        __ptr = NLS->content;
        *(undefined8 *)((long)__ptr + 0x18) = 0;
      }
      if (*(void **)((long)__ptr + 0x30) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x30));
        __ptr = NLS->content;
        *(undefined8 *)((long)__ptr + 0x30) = 0;
      }
      if (*(void **)((long)__ptr + 0x38) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x38));
        __ptr = NLS->content;
        *(undefined8 *)((long)__ptr + 0x38) = 0;
      }
      if (*(void **)((long)__ptr + 0x40) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x40));
        __ptr = NLS->content;
        *(undefined8 *)((long)__ptr + 0x40) = 0;
      }
      if (*(long *)((long)__ptr + 0x48) != 0) {
        N_VDestroyVectorArray(*(long *)((long)__ptr + 0x48),*(undefined4 *)((long)__ptr + 0x10));
        __ptr = NLS->content;
        *(undefined8 *)((long)__ptr + 0x48) = 0;
      }
      if (*(long *)((long)__ptr + 0x50) != 0) {
        N_VDestroyVectorArray(*(long *)((long)__ptr + 0x50),*(undefined4 *)((long)__ptr + 0x10));
        __ptr = NLS->content;
        *(undefined8 *)((long)__ptr + 0x50) = 0;
      }
      if (*(long *)((long)__ptr + 0x58) != 0) {
        N_VDestroyVectorArray(*(long *)((long)__ptr + 0x58),*(undefined4 *)((long)__ptr + 0x10));
        __ptr = NLS->content;
        *(undefined8 *)((long)__ptr + 0x58) = 0;
      }
      if (*(void **)((long)__ptr + 0x60) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x60));
        __ptr = NLS->content;
        *(undefined8 *)((long)__ptr + 0x60) = 0;
      }
      free(__ptr);
      NLS->content = (void *)0x0;
    }
    if (NLS->ops != (SUNNonlinearSolver_Ops)0x0) {
      free(NLS->ops);
    }
    free(NLS);
  }
  return 0;
}

Assistant:

SUNErrCode SUNNonlinSolFree_FixedPoint(SUNNonlinearSolver NLS)
{
  /* return if NLS is already free */
  if (NLS == NULL) { return SUN_SUCCESS; }

  /* free items from content structure, then the structure itself */
  if (NLS->content)
  {
    FreeContent(NLS);
    free(NLS->content);
    NLS->content = NULL;
  }

  /* free the ops structure */
  if (NLS->ops)
  {
    free(NLS->ops);
    NLS->ops = NULL;
  }

  /* free the overall NLS structure */
  free(NLS);

  return SUN_SUCCESS;
}